

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode Curl_protocol_connect(connectdata *conn,_Bool *protocol_done)

{
  SessionHandle *data_00;
  CURLcode CVar1;
  timeval tVar2;
  __time_t local_40;
  __suseconds_t local_38;
  SessionHandle *data;
  CURLcode result;
  _Bool *protocol_done_local;
  connectdata *conn_local;
  
  data._4_4_ = CURLE_OK;
  data_00 = conn->data;
  *protocol_done = false;
  if ((((conn->bits).tcpconnect[0] & 1U) == 0) || (((conn->bits).protoconnstart & 1U) == 0)) {
    Curl_pgrsTime(data_00,TIMER_CONNECT);
    Curl_verboseconnect(conn);
    if (((conn->bits).protoconnstart & 1U) == 0) {
      tVar2 = curlx_tvnow();
      local_40 = tVar2.tv_sec;
      (conn->now).tv_sec = local_40;
      local_38 = tVar2.tv_usec;
      (conn->now).tv_usec = local_38;
      CVar1 = Curl_proxy_connect(conn);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      if (conn->handler->connect_it == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
        *protocol_done = true;
        data._4_4_ = CURLE_OK;
      }
      else {
        data._4_4_ = (*conn->handler->connect_it)(conn,protocol_done);
      }
      if (data._4_4_ == CURLE_OK) {
        (conn->bits).protoconnstart = true;
      }
    }
    conn_local._4_4_ = data._4_4_;
  }
  else {
    if (conn->handler->connecting == (_func_CURLcode_connectdata_ptr__Bool_ptr *)0x0) {
      *protocol_done = true;
    }
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_protocol_connect(struct connectdata *conn,
                               bool *protocol_done)
{
  CURLcode result=CURLE_OK;
  struct SessionHandle *data = conn->data;

  *protocol_done = FALSE;

  if(conn->bits.tcpconnect[FIRSTSOCKET] && conn->bits.protoconnstart) {
    /* We already are connected, get back. This may happen when the connect
       worked fine in the first call, like when we connect to a local server
       or proxy. Note that we don't know if the protocol is actually done.

       Unless this protocol doesn't have any protocol-connect callback, as
       then we know we're done. */
    if(!conn->handler->connecting)
      *protocol_done = TRUE;

    return CURLE_OK;
  }

  Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
  Curl_verboseconnect(conn);

  if(!conn->bits.protoconnstart) {

    /* Set start time here for timeout purposes in the connect procedure, it
       is later set again for the progress meter purpose */
    conn->now = Curl_tvnow();

    result = Curl_proxy_connect(conn);
    if(result)
      return result;

    if(conn->handler->connect_it) {
      /* is there a protocol-specific connect() procedure? */

      /* Call the protocol-specific connect function */
      result = conn->handler->connect_it(conn, protocol_done);
    }
    else
      *protocol_done = TRUE;

    /* it has started, possibly even completed but that knowledge isn't stored
       in this bit! */
    if(!result)
      conn->bits.protoconnstart = TRUE;
  }

  return result; /* pass back status */
}